

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execCmpiEa<(moira::Instr)39,(moira::Mode)6,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 op1;
  u32 data;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  op1 = readI<(moira::Size)1>(this);
  bVar1 = readOp<(moira::Mode)6,(moira::Size)1,128ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    prefetch<0ul>(this);
    cmp<(moira::Size)1>(this,op1,local_20);
  }
  return;
}

Assistant:

void
Moira::execCmpiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    prefetch();

    cmp<S>(src, data);
}